

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void mpt_copy64(int pts,uint64_t *src,int lds,uint64_t *dest,int ldd)

{
  ulong uVar1;
  bool bVar2;
  
  if (0 < pts) {
    if (ldd == 0) {
      *dest = src[(pts + -1) * lds];
    }
    else if (lds == 0) {
      for (uVar1 = 0; (uint)pts != uVar1; uVar1 = uVar1 + 1) {
        dest[uVar1] = *src;
      }
    }
    else if (ldd == 1 && lds == 1) {
      for (uVar1 = 0; (uint)pts != uVar1; uVar1 = uVar1 + 1) {
        dest[uVar1] = src[uVar1];
      }
    }
    else {
      while (bVar2 = pts != 0, pts = pts + -1, bVar2) {
        *dest = *src;
        src = src + lds;
        dest = dest + ldd;
      }
    }
  }
  return;
}

Assistant:

extern void MPT_COPY_FCN(int pts, const MPT_COPY_ST *src, int lds, MPT_COPY_DT *dest, int ldd)
{
	int i, j;
	
	if (pts <= 0) {
		return;
	}
	if (!ldd) {
		dest[0] = src[(pts - 1) * lds];
		return;
	}
	if (!lds) {
		for (i = 0; i < pts; i++) {
			dest[i] = src[0];
		}
		return;
	}
	if (lds == 1 && ldd == 1) {
		for (i = 0; i < pts; i++) {
			dest[i] = src[i];
		}
		return;
	}
	for (i = 0, j = 0; pts--; i += ldd, j += lds) {
		dest[i] = src[j];
	}
}